

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O3

Stats * __thiscall Arena::stats(Stats *__return_storage_ptr__,Arena *this)

{
  long lVar1;
  size_t sVar2;
  _Hash_node_base *p_Var3;
  size_t sVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->chunks_used = (this->chunks_used)._M_h._M_element_count;
  __return_storage_ptr__->chunks_free = (this->chunks_free)._M_h._M_element_count;
  sVar2 = 0;
  for (p_Var3 = (this->chunks_used)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
      p_Var3 = p_Var3->_M_nxt) {
    sVar2 = (long)&(p_Var3[2]._M_nxt)->_M_nxt + sVar2;
  }
  __return_storage_ptr__->used = sVar2;
  sVar4 = 0;
  for (p_Var3 = (this->chunks_free)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
      p_Var3 = p_Var3->_M_nxt) {
    sVar4 = (long)&(p_Var3[2]._M_nxt[4]._M_nxt)->_M_nxt + sVar4;
  }
  __return_storage_ptr__->free = sVar4;
  __return_storage_ptr__->total = sVar2 + sVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

Arena::Stats Arena::stats() const
{
    Arena::Stats r{ 0, 0, 0, chunks_used.size(), chunks_free.size() };
    for (const auto& chunk: chunks_used)
        r.used += chunk.second;
    for (const auto& chunk: chunks_free)
        r.free += chunk.second->first;
    r.total = r.used + r.free;
    return r;
}